

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool duckdb_snappy::
     InternalUncompressAllTags<duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>>
               (SnappyDecompressor *decompressor,
               SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *writer,
               uint32_t compressed_len,uint32_t uncompressed_len)

{
  bool bVar1;
  
  writer->expected_ = (ulong)compressed_len;
  SnappyDecompressor::
  DecompressAllTags<duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>>
            (decompressor,writer);
  SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::Flush(writer);
  if (decompressor->eof_ == true) {
    bVar1 = writer->op_ptr_ + (writer->full_size_ - (long)writer->op_base_) ==
            (char *)writer->expected_;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool InternalUncompressAllTags(SnappyDecompressor* decompressor,
                                      Writer* writer, uint32_t compressed_len,
                                      uint32_t uncompressed_len) {
    int token = 0;
  Report(token, "snappy_uncompress", compressed_len, uncompressed_len);

  writer->SetExpectedLength(uncompressed_len);

  // Process the entire input
  decompressor->DecompressAllTags(writer);
  writer->Flush();
  return (decompressor->eof() && writer->CheckLength());
}